

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_secp256k1.cpp
# Opt level: O3

void __thiscall
Secp256k1_RangeProofInfoSecp256k1ErrorTest_Test::TestBody
          (Secp256k1_RangeProofInfoSecp256k1ErrorTest_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  secp256k1_context_struct *context;
  AssertionResult gtest_ar;
  int mantissa;
  int exponent;
  Secp256k1 secp;
  ByteData range_proof;
  uint64_t max_value;
  uint64_t min_value;
  AssertHelper aAStack_88 [2];
  string local_78;
  int local_58;
  int local_54;
  Secp256k1 local_50;
  ByteData local_48;
  uint64_t local_30;
  uint64_t local_28;
  
  context = wally_get_secp_context();
  cfd::core::Secp256k1::Secp256k1(&local_50,context);
  paVar1 = &local_78.field_2;
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"","");
  cfd::core::ByteData::ByteData(&local_48,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    cfd::core::Secp256k1::RangeProofInfoSecp256k1
              (&local_50,&local_48,&local_54,&local_58,&local_28,&local_30);
  }
  testing::Message::Message((Message *)&local_78);
  testing::internal::AssertHelper::AssertHelper
            (aAStack_88,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_secp256k1.cpp"
             ,0x1bd,
             "Expected: secp.RangeProofInfoSecp256k1(range_proof, &exponent, &mantissa, &min_value, &max_value) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(aAStack_88,(Message *)&local_78);
  testing::internal::AssertHelper::~AssertHelper(aAStack_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0)) {
      (**(code **)(*(size_type *)local_78._M_dataplus._M_p + 8))();
    }
  }
  if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  local_78._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"0000","");
  cfd::core::ByteData::ByteData(&local_48,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != paVar1) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    cfd::core::Secp256k1::RangeProofInfoSecp256k1
              (&local_50,&local_48,&local_54,&local_58,&local_28,&local_30);
  }
  testing::Message::Message((Message *)&local_78);
  testing::internal::AssertHelper::AssertHelper
            (aAStack_88,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/external/cfd-core/test/test_secp256k1.cpp"
             ,0x1c8,
             "Expected: secp.RangeProofInfoSecp256k1(range_proof, &exponent, &mantissa, &min_value, &max_value) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(aAStack_88,(Message *)&local_78);
  testing::internal::AssertHelper::~AssertHelper(aAStack_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) &&
       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0)) {
      (**(code **)(*(size_type *)local_78._M_dataplus._M_p + 8))();
    }
  }
  if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(Secp256k1, RangeProofInfoSecp256k1ErrorTest) {
  struct secp256k1_context_struct *ctx = wally_get_secp_context();
  Secp256k1 secp = Secp256k1(ctx);

  int exponent;
  int mantissa;
  uint64_t min_value;
  uint64_t max_value;
  // empty range_proof
  {
    ByteData range_proof("");
    try {
      EXPECT_THROW(secp.RangeProofInfoSecp256k1(range_proof, &exponent, &mantissa, &min_value, &max_value), CfdException);
    } catch (const CfdException &cfd_exception) {
      EXPECT_EQ(cfd_exception.GetErrorCode(), CfdError::kCfdIllegalArgumentError);
      EXPECT_STREQ(cfd_exception.what(), "Secp256k1 empty range proof Error.");
    }
  }

  // invalid range_proof
  {
    ByteData range_proof("0000");
    try {
      EXPECT_THROW(secp.RangeProofInfoSecp256k1(range_proof, &exponent, &mantissa, &min_value, &max_value), CfdException);
    } catch (const CfdException &cfd_exception) {
      EXPECT_EQ(cfd_exception.GetErrorCode(), CfdError::kCfdIllegalArgumentError);
      EXPECT_STREQ(cfd_exception.what(), "Secp256k1 empty range proof Error.");
    }
  }
}